

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChakraRtInterface.cpp
# Opt level: O0

void ChakraRTInterface::UnloadChakraDll(HINSTANCE library)

{
  PAL_FILE *pPVar1;
  code *pcVar2;
  PDLLMAIN pDllMain;
  FARPROC pDllCanUnloadNow;
  HINSTANCE library_local;
  
  if (library == (HINSTANCE)0x0) {
    pPVar1 = PAL_get_stderr(0);
    PAL_fprintf(pPVar1,"ASSERTION (%s, line %d) %s %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/bin/ch/ChakraRtInterface.cpp"
                ,0xdb,"library != nullptr");
    pPVar1 = PAL_get_stderr(0);
    PAL_fflush(pPVar1);
    DebugBreak();
  }
  pcVar2 = (code *)GetChakraCoreSymbol(library,"DllCanUnloadNow");
  if (pcVar2 != (code *)0x0) {
    (*pcVar2)();
  }
  pcVar2 = (code *)GetChakraCoreSymbol(library,"DllMain");
  if (pcVar2 != (code *)0x0) {
    (*pcVar2)(library,0,0);
  }
  return;
}

Assistant:

void ChakraRTInterface::UnloadChakraDll(HINSTANCE library)
{
#ifndef CHAKRA_STATIC_LIBRARY
    Assert(library != nullptr);
    FARPROC pDllCanUnloadNow = (FARPROC) GetChakraCoreSymbol(library, "DllCanUnloadNow");
    if (pDllCanUnloadNow != nullptr)
    {
        pDllCanUnloadNow();
    }
#ifdef _WIN32
    UnloadChakraCore(library);
#else  // !_WIN32
    // PAL thread shutdown needs more time after execution completion.
    // Do not FreeLibrary. Invoke DllMain(DLL_PROCESS_DETACH) directly.
    typedef BOOL (__stdcall *PDLLMAIN)(HINSTANCE, DWORD, LPVOID);
    PDLLMAIN pDllMain = (PDLLMAIN) GetChakraCoreSymbol(library, "DllMain");
    if (pDllMain)
    {
        pDllMain(library, DLL_PROCESS_DETACH, NULL);
    }
#endif
#endif
}